

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_sifm.cc
# Opt level: O2

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::Sifm::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,Sifm *this)

{
  mt19937 *this_00;
  TestOptions *opt;
  pointer ppSVar1;
  const_iterator cVar2;
  MthdSifmDvDy *pMVar3;
  MthdSifmDuDx *pMVar4;
  MthdSifmRect *pMVar5;
  MthdSifmXy *pMVar6;
  MthdClipRect *pMVar7;
  MthdClipXy *pMVar8;
  MthdOperation *pMVar9;
  MthdMissing *pMVar10;
  MthdCtxBeta *pMVar11;
  uint32_t uVar12;
  uint uVar13;
  MthdDmaGrobj *pMVar14;
  result_type rVar15;
  SingleMthdTest *pSVar16;
  MthdCtxPattern *this_01;
  MthdSifmSrcSize *this_02;
  MthdSifmOffset *this_03;
  MthdSifmSrcPos *this_04;
  MthdCtxSurf *pMVar17;
  MthdCtxBeta4 *this_05;
  MthdCtxSurf2D *this_06;
  MthdSync *this_07;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l_00;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l_01;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l_02;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l_03;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l_04;
  uint32_t uVar18;
  uint32_t in_stack_fffffffffffffb98;
  allocator_type local_447;
  allocator local_446;
  allocator local_445;
  allocator local_444;
  allocator local_443;
  allocator local_442;
  allocator local_441;
  allocator local_440;
  allocator local_43f;
  allocator local_43e;
  allocator local_43d;
  allocator local_43c;
  allocator local_43b;
  allocator local_43a;
  allocator local_439;
  allocator local_438;
  allocator local_437;
  allocator local_436;
  allocator local_435;
  allocator local_434;
  allocator local_433;
  allocator local_432;
  allocator local_431;
  SingleMthdTest *local_430;
  MthdDmaGrobj *local_428;
  const_iterator local_420;
  string local_418;
  string local_3f8;
  MthdSifmDvDy *local_3d8;
  MthdSifmDuDx *local_3d0;
  MthdSifmRect *local_3c8;
  MthdSifmXy *local_3c0;
  MthdClipRect *local_3b8;
  MthdClipXy *local_3b0;
  MthdOperation *local_3a8;
  SingleMthdTest *local_3a0;
  MthdMissing *local_398;
  MthdCtxBeta *local_390;
  string local_388;
  string local_368;
  SingleMthdTest *local_348;
  MthdCtxPattern *local_340;
  SingleMthdTest *local_338;
  SingleMthdTest *local_330;
  MthdDmaGrobj *local_328;
  string local_320;
  string local_300;
  SingleMthdTest *local_2e0;
  MthdDmaGrobj *local_2d8;
  MthdCtxPattern *local_2d0;
  SingleMthdTest *local_2c8;
  MthdCtxBeta *local_2c0;
  MthdMissing *local_2b8;
  SingleMthdTest *local_2b0;
  MthdOperation *local_2a8;
  MthdClipXy *local_2a0;
  MthdClipRect *local_298;
  MthdSifmXy *local_290;
  MthdSifmRect *local_288;
  MthdSifmDuDx *local_280;
  MthdSifmDvDy *local_278;
  MthdSifmSrcSize *local_270;
  SingleMthdTest *local_268;
  MthdSifmOffset *local_260;
  MthdSifmSrcPos *local_258;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pMVar14 = (MthdDmaGrobj *)operator_new(0x25950);
  this_00 = &(this->super_Class).rnd;
  local_328 = pMVar14;
  rVar15 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_418,"nop",&local_431);
  opt = &(this->super_Class).opt;
  MthdNop::SingleMthdTest
            ((MthdNop *)pMVar14,opt,(uint32_t)rVar15,&local_418,-1,(this->super_Class).cls,0x100,1,4
            );
  local_300._M_dataplus._M_p = (pointer)pMVar14;
  pSVar16 = (SingleMthdTest *)operator_new(0x25950);
  rVar15 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_3f8,"notify",&local_432);
  MthdNotify::SingleMthdTest
            ((MthdNotify *)pSVar16,opt,(uint32_t)rVar15,&local_3f8,0,(this->super_Class).cls,0x104,1
             ,4);
  local_300._M_string_length = (size_type)pSVar16;
  pSVar16 = (SingleMthdTest *)operator_new(0x25950);
  local_330 = pSVar16;
  rVar15 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_368,"patch",&local_433);
  MthdPatch::SingleMthdTest
            ((MthdPatch *)pSVar16,opt,(uint32_t)rVar15,&local_368,-1,(this->super_Class).cls,0x10c,1
             ,4);
  local_300.field_2._M_allocated_capacity = (size_type)pSVar16;
  local_420._M_current = (SingleMthdTest **)operator_new(0x25950);
  rVar15 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_388,"pm_trigger",&local_434);
  cVar2._M_current = local_420._M_current;
  MthdPmTrigger::SingleMthdTest
            ((MthdPmTrigger *)local_420._M_current,opt,(uint32_t)rVar15,&local_388,-1,
             (this->super_Class).cls,0x140,1,4);
  local_300.field_2._8_8_ = cVar2._M_current;
  pSVar16 = (SingleMthdTest *)operator_new(0x25950);
  local_338 = pSVar16;
  rVar15 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_320,"dma_notify",&local_435);
  MthdDmaNotify::SingleMthdTest
            ((MthdDmaNotify *)pSVar16,opt,(uint32_t)rVar15,&local_320,1,(this->super_Class).cls,
             0x180,1,4);
  local_2e0 = pSVar16;
  local_428 = (MthdDmaGrobj *)operator_new(0x25960);
  rVar15 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_1d0,"dma_src",&local_436);
  pMVar14 = local_428;
  MthdDmaGrobj::MthdDmaGrobj
            (local_428,opt,(uint32_t)rVar15,&local_1d0,2,(this->super_Class).cls,0x184,0,0);
  local_2d8 = pMVar14;
  this_01 = (MthdCtxPattern *)operator_new(0x25958);
  local_340 = this_01;
  rVar15 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_1f0,"ctx_pattern",&local_437);
  uVar12 = (this->super_Class).cls;
  MthdCtxPattern::MthdCtxPattern
            (this_01,opt,(uint32_t)rVar15,&local_1f0,3,uVar12,0x188,uVar12 != 0x37);
  local_2d0 = this_01;
  local_430 = (SingleMthdTest *)operator_new(0x25950);
  rVar15 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_210,"ctx_rop",&local_438);
  pSVar16 = local_430;
  MthdCtxRop::SingleMthdTest
            ((MthdCtxRop *)local_430,opt,(uint32_t)rVar15,&local_210,4,(this->super_Class).cls,0x18c
             ,1,4);
  local_2c8 = pSVar16;
  local_390 = (MthdCtxBeta *)operator_new(0x25950);
  rVar15 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_230,"ctx_beta",&local_439);
  pMVar11 = local_390;
  MthdCtxBeta::SingleMthdTest
            (local_390,opt,(uint32_t)rVar15,&local_230,5,(this->super_Class).cls,400,1,4);
  local_2c0 = pMVar11;
  local_398 = (MthdMissing *)operator_new(0x25950);
  rVar15 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_250,"missing",&local_43a);
  pMVar10 = local_398;
  MthdMissing::SingleMthdTest
            (local_398,opt,(uint32_t)rVar15,&local_250,-1,(this->super_Class).cls,0x200,1,4);
  local_2b8 = pMVar10;
  local_3a0 = (SingleMthdTest *)operator_new(0x25958);
  rVar15 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_50,"format",&local_43b);
  pSVar16 = local_3a0;
  uVar12 = (this->super_Class).cls;
  pgraph::SingleMthdTest::SingleMthdTest
            (local_3a0,opt,(uint32_t)rVar15,&local_50,8,uVar12,0x300,1,4);
  (pSVar16->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00313450;
  *(bool *)&pSVar16[1].super_MthdTest.super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       uVar12 != 0x37;
  local_2b0 = pSVar16;
  local_3a8 = (MthdOperation *)operator_new(0x25958);
  rVar15 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_70,"operation",&local_43c);
  pMVar9 = local_3a8;
  uVar12 = (this->super_Class).cls;
  MthdOperation::MthdOperation
            (local_3a8,opt,(uint32_t)rVar15,&local_70,9,uVar12,0x304,uVar12 != 0x37);
  local_2a8 = pMVar9;
  local_3b0 = (MthdClipXy *)operator_new(0x25958);
  rVar15 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_90,"clip_xy",&local_43d);
  pMVar8 = local_3b0;
  MthdClipXy::MthdClipXy
            (local_3b0,opt,(uint32_t)rVar15,&local_90,10,(this->super_Class).cls,0x308,1,false);
  local_2a0 = pMVar8;
  local_3b8 = (MthdClipRect *)operator_new(0x25958);
  rVar15 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_b0,"clip_rect",&local_43e);
  pMVar7 = local_3b8;
  MthdClipRect::MthdClipRect
            (local_3b8,opt,(uint32_t)rVar15,&local_b0,0xb,(this->super_Class).cls,0x30c,1);
  local_298 = pMVar7;
  local_3c0 = (MthdSifmXy *)operator_new(0x25950);
  rVar15 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  uVar12 = 0x1c5331;
  std::__cxx11::string::string((string *)&local_d0,"xy",&local_43f);
  pMVar6 = local_3c0;
  anon_unknown_5::MthdSifmXy::SingleMthdTest
            (local_3c0,opt,(uint32_t)rVar15,&local_d0,0xc,(this->super_Class).cls,0x310,uVar12,
             in_stack_fffffffffffffb98);
  local_290 = pMVar6;
  local_3c8 = (MthdSifmRect *)operator_new(0x25950);
  rVar15 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  uVar18 = 0x1c53ab;
  std::__cxx11::string::string((string *)&local_f0,"rect",&local_440);
  pMVar5 = local_3c8;
  uVar12 = (this->super_Class).cls;
  anon_unknown_5::MthdSifmRect::SingleMthdTest
            (local_3c8,opt,(uint32_t)rVar15,&local_f0,
             (uVar12 != 0x37) + 0xb + (uint)(uVar12 != 0x37),uVar12,0x314,uVar18,
             in_stack_fffffffffffffb98);
  local_288 = pMVar5;
  local_3d0 = (MthdSifmDuDx *)operator_new(0x25958);
  rVar15 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_110,"dudx",&local_441);
  pMVar4 = local_3d0;
  anon_unknown_5::MthdSifmDuDx::MthdSifmDuDx
            (local_3d0,opt,(uint32_t)rVar15,&local_110,0xe,(this->super_Class).cls,0x318,0);
  local_280 = pMVar4;
  local_3d8 = (MthdSifmDvDy *)operator_new(0x25958);
  rVar15 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_130,"dvdy",&local_442);
  pMVar3 = local_3d8;
  anon_unknown_5::MthdSifmDvDy::MthdSifmDvDy
            (local_3d8,opt,(uint32_t)rVar15,&local_130,0xf,(this->super_Class).cls,0x31c,0);
  local_278 = pMVar3;
  this_02 = (MthdSifmSrcSize *)operator_new(0x25958);
  rVar15 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_150,"src_size",&local_443);
  anon_unknown_5::MthdSifmSrcSize::MthdSifmSrcSize
            (this_02,opt,(uint32_t)rVar15,&local_150,0x10,(this->super_Class).cls,0x400,0);
  local_270 = this_02;
  pSVar16 = (SingleMthdTest *)operator_new(0x25950);
  local_348 = pSVar16;
  rVar15 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_170,"pitch",&local_444);
  pgraph::SingleMthdTest::SingleMthdTest
            (pSVar16,opt,(uint32_t)rVar15,&local_170,0x11,(this->super_Class).cls,0x404,1,4);
  (pSVar16->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00313a20;
  local_268 = pSVar16;
  this_03 = (MthdSifmOffset *)operator_new(0x25958);
  rVar15 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_190,"offset",&local_445);
  anon_unknown_5::MthdSifmOffset::MthdSifmOffset
            (this_03,opt,(uint32_t)rVar15,&local_190,0x12,(this->super_Class).cls,0x408,0);
  local_260 = this_03;
  this_04 = (MthdSifmSrcPos *)operator_new(0x25958);
  rVar15 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_1b0,"src_pos",&local_446);
  anon_unknown_5::MthdSifmSrcPos::MthdSifmSrcPos
            (this_04,opt,(uint32_t)rVar15,&local_1b0,0x13,(this->super_Class).cls,0x40c,0,true);
  __l._M_len = 0x16;
  __l._M_array = (iterator)&local_300;
  local_258 = this_04;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(__return_storage_ptr__,__l,&local_447);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_418);
  uVar12 = (this->super_Class).cls;
  if (uVar12 == 0xe) {
    ppSVar1 = (__return_storage_ptr__->
              super__Vector_base<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    pMVar14 = (MthdDmaGrobj *)operator_new(0x25950);
    local_428 = pMVar14;
    rVar15 = std::
             mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
             ::operator()(this_00);
    local_420._M_current = ppSVar1;
    std::__cxx11::string::string((string *)&local_418,"src_size_yuv420",(allocator *)&local_1d0);
    pgraph::SingleMthdTest::SingleMthdTest
              ((SingleMthdTest *)pMVar14,opt,(uint32_t)rVar15,&local_418,-1,(this->super_Class).cls,
               0x400,1,4);
    (pMVar14->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
    _vptr_Test = (_func_int **)&PTR__SingleMthdTest_00313d08;
    local_300._M_dataplus._M_p = (pointer)pMVar14;
    pSVar16 = (SingleMthdTest *)operator_new(0x25950);
    local_430 = pSVar16;
    rVar15 = std::
             mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
             ::operator()(this_00);
    std::__cxx11::string::string((string *)&local_3f8,"pitch_yuv420",(allocator *)&local_1f0);
    pgraph::SingleMthdTest::SingleMthdTest
              (pSVar16,opt,(uint32_t)rVar15,&local_3f8,-1,(this->super_Class).cls,0x404,1,4);
    (pSVar16->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
         (_func_int **)&PTR__SingleMthdTest_00313e00;
    local_300._M_string_length = (size_type)pSVar16;
    pSVar16 = (SingleMthdTest *)operator_new(0x25950);
    rVar15 = std::
             mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
             ::operator()(this_00);
    std::__cxx11::string::string((string *)&local_368,"offset_yuv420",(allocator *)&local_210);
    pgraph::SingleMthdTest::SingleMthdTest
              (pSVar16,opt,(uint32_t)rVar15,&local_368,-1,(this->super_Class).cls,0x408,3,4);
    (pSVar16->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
         (_func_int **)&PTR__SingleMthdTest_00313ef8;
    local_300.field_2._M_allocated_capacity = (size_type)pSVar16;
    pSVar16 = (SingleMthdTest *)operator_new(0x25950);
    rVar15 = std::
             mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
             ::operator()(this_00);
    std::__cxx11::string::string((string *)&local_388,"src_pos_yuv420",(allocator *)&local_230);
    pgraph::SingleMthdTest::SingleMthdTest
              (pSVar16,opt,(uint32_t)rVar15,&local_388,-1,(this->super_Class).cls,0x414,1,4);
    (pSVar16->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
         (_func_int **)&PTR__SingleMthdTest_00313ff0;
    local_300.field_2._8_8_ = pSVar16;
    pSVar16 = (SingleMthdTest *)operator_new(0x25950);
    rVar15 = std::
             mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
             ::operator()(this_00);
    std::__cxx11::string::string((string *)&local_320,"invalid_yuv420",(allocator *)&local_250);
    pgraph::SingleMthdTest::SingleMthdTest
              (pSVar16,opt,(uint32_t)rVar15,&local_320,-1,(this->super_Class).cls,0x410,2,4);
    (pSVar16->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
         (_func_int **)&PTR__SingleMthdTest_003140e8;
    __l_00._M_len = 5;
    __l_00._M_array = (iterator)&local_300;
    local_2e0 = pSVar16;
    std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
    ::insert(__return_storage_ptr__,local_420,__l_00);
    std::__cxx11::string::~string((string *)&local_320);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::__cxx11::string::~string((string *)&local_418);
    uVar12 = (this->super_Class).cls;
  }
  cVar2._M_current =
       (__return_storage_ptr__->
       super__Vector_base<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (uVar12 == 0x37) {
    pMVar17 = (MthdCtxSurf *)operator_new(0x25958);
    rVar15 = std::
             mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
             ::operator()(this_00);
    std::__cxx11::string::string((string *)&local_300,"ctx_dst",(allocator *)&local_3f8);
    MthdCtxSurf::MthdCtxSurf
              (pMVar17,opt,(uint32_t)rVar15,&local_300,7,(this->super_Class).cls,0x194,0);
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)&local_418;
    local_418._M_dataplus._M_p = (pointer)pMVar17;
    std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
    ::insert(__return_storage_ptr__,cVar2,__l_01);
  }
  else {
    this_05 = (MthdCtxBeta4 *)operator_new(0x25950);
    rVar15 = std::
             mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
             ::operator()(this_00);
    std::__cxx11::string::string((string *)&local_300,"ctx_beta4",(allocator *)&local_368);
    MthdCtxBeta4::SingleMthdTest
              (this_05,opt,(uint32_t)rVar15,&local_300,6,(this->super_Class).cls,0x194,1,4);
    local_3f8._M_dataplus._M_p = (pointer)this_05;
    this_06 = (MthdCtxSurf2D *)operator_new(0x25958);
    rVar15 = std::
             mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
             ::operator()(this_00);
    std::__cxx11::string::string((string *)&local_418,"ctx_surf2d",(allocator *)&local_388);
    uVar12 = (this->super_Class).cls;
    MthdCtxSurf2D::MthdCtxSurf2D
              (this_06,opt,(uint32_t)rVar15,&local_418,7,uVar12,0x198,uVar12 != 0x77 | 2);
    __l_02._M_len = 2;
    __l_02._M_array = (iterator)&local_3f8;
    local_3f8._M_string_length = (size_type)this_06;
    std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
    ::insert(__return_storage_ptr__,cVar2,__l_02);
    std::__cxx11::string::~string((string *)&local_418);
  }
  std::__cxx11::string::~string((string *)&local_300);
  uVar13 = (this->super_Class).cls;
  if (uVar13 == 99 || (char)uVar13 == -0x77) {
    cVar2._M_current =
         (__return_storage_ptr__->
         super__Vector_base<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
         )._M_impl.super__Vector_impl_data._M_start;
    pMVar17 = (MthdCtxSurf *)operator_new(0x25950);
    rVar15 = std::
             mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
             ::operator()(this_00);
    std::__cxx11::string::string((string *)&local_300,"dither",(allocator *)&local_3f8);
    MthdDither::SingleMthdTest
              ((MthdDither *)pMVar17,opt,(uint32_t)rVar15,&local_300,0x14,(this->super_Class).cls,
               0x2fc,1,4);
    __l_03._M_len = 1;
    __l_03._M_array = (iterator)&local_418;
    local_418._M_dataplus._M_p = (pointer)pMVar17;
    std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
    ::insert(__return_storage_ptr__,cVar2,__l_03);
    std::__cxx11::string::~string((string *)&local_300);
    uVar13 = (uint)(byte)(this->super_Class).cls;
  }
  if ((char)uVar13 == -0x77) {
    cVar2._M_current =
         (__return_storage_ptr__->
         super__Vector_base<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
         )._M_impl.super__Vector_impl_data._M_start;
    this_07 = (MthdSync *)operator_new(0x25950);
    rVar15 = std::
             mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
             ::operator()(this_00);
    std::__cxx11::string::string((string *)&local_300,"sync",(allocator *)&local_3f8);
    MthdSync::SingleMthdTest
              (this_07,opt,(uint32_t)rVar15,&local_300,-1,(this->super_Class).cls,0x108,1,4);
    __l_04._M_len = 1;
    __l_04._M_array = (iterator)&local_418;
    local_418._M_dataplus._M_p = (pointer)this_07;
    std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
    ::insert(__return_storage_ptr__,cVar2,__l_04);
    std::__cxx11::string::~string((string *)&local_300);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SingleMthdTest *> Sifm::mthds() {
	std::vector<SingleMthdTest *> res = {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPatch(opt, rnd(), "patch", -1, cls, 0x10c),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdDmaGrobj(opt, rnd(), "dma_src", 2, cls, 0x184, 0, DMA_R),
		new MthdCtxPattern(opt, rnd(), "ctx_pattern", 3, cls, 0x188, cls != 0x37),
		new MthdCtxRop(opt, rnd(), "ctx_rop", 4, cls, 0x18c),
		new MthdCtxBeta(opt, rnd(), "ctx_beta", 5, cls, 0x190),
		new MthdMissing(opt, rnd(), "missing", -1, cls, 0x200),
		new MthdSifmFormat(opt, rnd(), "format", 8, cls, 0x300, cls != 0x37),
		new MthdOperation(opt, rnd(), "operation", 9, cls, 0x304, cls != 0x37),
		new MthdClipXy(opt, rnd(), "clip_xy", 10, cls, 0x308, 1, 0),
		new MthdClipRect(opt, rnd(), "clip_rect", 11, cls, 0x30c, 1),
		new MthdSifmXy(opt, rnd(), "xy", 12, cls, 0x310),
		new MthdSifmRect(opt, rnd(), "rect", cls == 0x37 ? 11 : 13, cls, 0x314),
		new MthdSifmDuDx(opt, rnd(), "dudx", 14, cls, 0x318, 0),
		new MthdSifmDvDy(opt, rnd(), "dvdy", 15, cls, 0x31c, 0),
		new MthdSifmSrcSize(opt, rnd(), "src_size", 16, cls, 0x400, 0),
		new MthdSifmPitch(opt, rnd(), "pitch", 17, cls, 0x404),
		new MthdSifmOffset(opt, rnd(), "offset", 18, cls, 0x408, 0),
		new MthdSifmSrcPos(opt, rnd(), "src_pos", 19, cls, 0x40c, 0, true),
	};
	if (cls == 0xe) {
		res.insert(res.end(), {
			new MthdSyfmSrcSize(opt, rnd(), "src_size_yuv420", -1, cls, 0x400),
			new MthdSyfmPitch(opt, rnd(), "pitch_yuv420", -1, cls, 0x404),
			new MthdSyfmOffset(opt, rnd(), "offset_yuv420", -1, cls, 0x408, 3),
			new MthdSyfmSrcPos(opt, rnd(), "src_pos_yuv420", -1, cls, 0x414),
			new MthdSifmInvalid(opt, rnd(), "invalid_yuv420", -1, cls, 0x410, 2),
		});
	}
	if (cls == 0x37) {
		res.insert(res.end(), {
			new MthdCtxSurf(opt, rnd(), "ctx_dst", 7, cls, 0x194, 0),
		});
	} else {
		res.insert(res.end(), {
			new MthdCtxBeta4(opt, rnd(), "ctx_beta4", 6, cls, 0x194),
			new MthdCtxSurf2D(opt, rnd(), "ctx_surf2d", 7, cls, 0x198, (cls == 0x77 ? SURF2D_NV4 : SURF2D_NV10) | SURF2D_SWZOK),
		});
	}
	if (cls == 0x63 || (cls & 0xff) == 0x89) {
		res.insert(res.begin(), {
			new MthdDither(opt, rnd(), "dither", 20, cls, 0x2fc),
		});
	}
	if ((cls & 0xff) == 0x89) {
		res.insert(res.begin(), {
			new MthdSync(opt, rnd(), "sync", -1, cls, 0x108),
		});
	}
	return res;
}